

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

void __thiscall
FreeTypeFaceWrapper::FreeTypeFaceWrapper
          (FreeTypeFaceWrapper *this,FT_Face inFace,string *inFontFilePath,string *inPFMFilePath,
          long inFontIndex,bool inDoOwn)

{
  bool bVar1;
  FreeTypeFaceWrapper *this_00;
  string fileExtension;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  (this->mFontFilePath)._M_dataplus._M_p = (pointer)&(this->mFontFilePath).field_2;
  (this->mFontFilePath)._M_string_length = 0;
  (this->mFontFilePath).field_2._M_local_buf[0] = '\0';
  (this->mNotDefGlyphName)._M_dataplus._M_p = (pointer)&(this->mNotDefGlyphName).field_2;
  (this->mNotDefGlyphName)._M_string_length = 0;
  (this->mNotDefGlyphName).field_2._M_local_buf[0] = '\0';
  this->mFace = inFace;
  this_00 = (FreeTypeFaceWrapper *)inFontFilePath;
  std::__cxx11::string::_M_assign((string *)&this->mFontFilePath);
  this->mFontIndex = inFontIndex;
  this->mDoesOwn = inDoOwn;
  this->mGlyphIsLoaded = false;
  this->mPaletteSet = false;
  this->mPalette = (FT_Color *)0x0;
  this->mPaletteStatus = 0;
  GetExtension(&local_70,this_00,inPFMFilePath);
  bVar1 = std::operator==(&local_70,"PFM");
  if (!bVar1) {
    bVar1 = std::operator==(&local_70,"pfm");
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_71);
      SetupFormatSpecificExtender(this,inFontFilePath,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00187c8f;
    }
  }
  SetupFormatSpecificExtender(this,inFontFilePath,inPFMFilePath);
LAB_00187c8f:
  SelectDefaultEncoding(this);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

FreeTypeFaceWrapper::FreeTypeFaceWrapper(FT_Face inFace,const std::string& inFontFilePath,const std::string& inPFMFilePath,long inFontIndex, bool inDoOwn)
{
    mFace = inFace;
	mFontFilePath = inFontFilePath;
    mFontIndex = inFontIndex;
	mDoesOwn = inDoOwn;
	mGlyphIsLoaded = false;
	ResetPaletteSelectionState();
	std::string fileExtension = GetExtension(inPFMFilePath);
	if (fileExtension == "PFM" || fileExtension == "pfm") // just don't bother if it's not PFM
		SetupFormatSpecificExtender(inFontFilePath, inPFMFilePath);
	else
		SetupFormatSpecificExtender(inFontFilePath, "");
	SelectDefaultEncoding();
}